

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

shared_ptr<libtorrent::torrent_info> __thiscall
libtorrent::aux::torrent::get_torrent_copy_with_hashes(torrent *this)

{
  undefined1 *this_00;
  bool bVar1;
  element_type *peVar2;
  reference this_01;
  size_type sVar3;
  difference_type dVar4;
  char *__first;
  char *pcVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long in_RSI;
  shared_ptr<libtorrent::torrent_info> sVar7;
  container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
  local_100;
  char *local_e8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_e0;
  const_iterator local_d8;
  int local_cc;
  reference local_c8;
  digest32<256L> *h;
  const_iterator __end4;
  const_iterator __begin4;
  vector<sha256_hash> *__range4;
  vector<char,_std::allocator<char>_> out_layer;
  vector<sha256_hash> *layer;
  merkle_tree *tree;
  const_iterator __end3;
  const_iterator __begin3;
  vector<aux::merkle_tree,_file_index_t> *__range3;
  vector<aux::vector<char>,_file_index_t> v2_hashes;
  undefined1 local_28 [8];
  shared_ptr<libtorrent::torrent_info> ret;
  torrent *this_local;
  
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(in_RSI + 0x18));
  bVar1 = torrent_info::is_valid(peVar2);
  if (!bVar1) {
    ::std::shared_ptr<libtorrent::torrent_info>::shared_ptr
              ((shared_ptr<libtorrent::torrent_info> *)this);
    _Var6._M_pi = extraout_RDX;
    goto LAB_0068c484;
  }
  ::std::__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)(in_RSI + 0x18));
  ::std::make_shared<libtorrent::torrent_info,libtorrent::torrent_info&>((torrent_info *)local_28);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  bVar1 = torrent_info::v2(peVar2);
  if (bVar1) {
    container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
    ::container_wrapper((container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
                         *)&__range3);
    __end3 = ::std::
             vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>::
             begin((vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                    *)(in_RSI + 0x3f8));
    tree = (merkle_tree *)
           ::std::
           vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>::end
                     ((vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                       *)(in_RSI + 0x3f8));
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_libtorrent::aux::merkle_tree_*,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
                                       *)&tree), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<const_libtorrent::aux::merkle_tree_*,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
                ::operator*(&__end3);
      merkle_tree::get_piece_layer
                ((vector<sha256_hash> *)
                 &out_layer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 this_01);
      this_00 = &out_layer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
      ::std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&__range4);
      sVar3 = ::std::
              vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::size
                        ((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          *)this_00);
      dVar4 = digest32<256L>::size();
      ::std::vector<char,_std::allocator<char>_>::reserve
                ((vector<char,_std::allocator<char>_> *)&__range4,sVar3 * dVar4);
      __end4 = ::std::
               vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
               begin((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      *)this_00);
      h = (digest32<256L> *)
          ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
          end((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> *)
              this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                                         *)&h), bVar1) {
        local_c8 = __gnu_cxx::
                   __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                   ::operator*(&__end4);
        bVar1 = digest32<256L>::is_all_zeros(local_c8);
        if (bVar1) {
          ::std::shared_ptr<libtorrent::torrent_info>::shared_ptr
                    ((shared_ptr<libtorrent::torrent_info> *)this);
          local_cc = 1;
          goto LAB_0068c394;
        }
        local_e0._M_current =
             (char *)::std::vector<char,_std::allocator<char>_>::end
                               ((vector<char,_std::allocator<char>_> *)&__range4);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_d8,&local_e0);
        __first = digest32<256L>::data(local_c8);
        pcVar5 = digest32<256L>::data(local_c8);
        dVar4 = digest32<256L>::size();
        local_e8 = (char *)::std::vector<char,std::allocator<char>>::insert<char_const*,void>
                                     ((vector<char,std::allocator<char>> *)&__range4,local_d8,
                                      __first,pcVar5 + dVar4);
        __gnu_cxx::
        __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
        ::operator++(&__end4);
      }
      ::std::
      vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>
      ::emplace_back<std::vector<char,std::allocator<char>>>
                ((vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>
                  *)&__range3,(vector<char,_std::allocator<char>_> *)&__range4);
      local_cc = 0;
LAB_0068c394:
      ::std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&__range4);
      container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
      ::~container_wrapper
                ((container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                  *)&out_layer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      if (local_cc != 0) goto LAB_0068c41a;
      __gnu_cxx::
      __normal_iterator<const_libtorrent::aux::merkle_tree_*,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
      ::operator++(&__end3);
    }
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
    ::container_wrapper(&local_100,
                        (container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
                         *)&__range3);
    torrent_info::set_piece_layers(peVar2,&local_100);
    container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
    ::~container_wrapper(&local_100);
    local_cc = 0;
LAB_0068c41a:
    container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
    ::~container_wrapper
              ((container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
                *)&__range3);
    if (local_cc == 0) goto LAB_0068c454;
  }
  else {
LAB_0068c454:
    ::std::shared_ptr<libtorrent::torrent_info>::shared_ptr
              ((shared_ptr<libtorrent::torrent_info> *)this,
               (shared_ptr<libtorrent::torrent_info> *)local_28);
    local_cc = 1;
  }
  ::std::shared_ptr<libtorrent::torrent_info>::~shared_ptr
            ((shared_ptr<libtorrent::torrent_info> *)local_28);
  _Var6._M_pi = extraout_RDX_00;
LAB_0068c484:
  sVar7.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::torrent_info>)
         sVar7.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_info> torrent::get_torrent_copy_with_hashes() const
	{
		if (!m_torrent_file->is_valid()) return {};
		auto ret = std::make_shared<torrent_info>(*m_torrent_file);

		if (ret->v2())
		{
			aux::vector<aux::vector<char>, file_index_t> v2_hashes;
			for (auto const& tree : m_merkle_trees)
			{
				auto const& layer = tree.get_piece_layer();
				std::vector<char> out_layer;
				out_layer.reserve(layer.size() * sha256_hash::size());
				for (auto const& h : layer)
				{
					// we're missing a piece layer. We can't return a valid
					// torrent
					if (h.is_all_zeros()) return {};
					out_layer.insert(out_layer.end(), h.data(), h.data() + sha256_hash::size());
				}
				v2_hashes.emplace_back(std::move(out_layer));
			}
			ret->set_piece_layers(std::move(v2_hashes));
		}

		return ret;
	}